

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

double __thiscall
RandomForest::Node<float>::PredictOneSample
          (Node<float> *this,shared_ptr<std::vector<float,_std::allocator<float>_>_> *i_inData)

{
  element_type *this_00;
  reference pvVar1;
  element_type *peVar2;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> local_50 [2];
  shared_ptr<std::vector<float,_std::allocator<float>_>_> local_30;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> *local_20;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> *i_inData_local;
  Node<float> *this_local;
  
  if (this->featureIndex == -1) {
    this_local = (Node<float> *)this->splitValue;
  }
  else {
    local_20 = i_inData;
    i_inData_local = (shared_ptr<std::vector<float,_std::allocator<float>_>_> *)this;
    this_00 = std::
              __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)i_inData);
    pvVar1 = std::vector<float,_std::allocator<float>_>::at(this_00,(long)this->featureIndex);
    if ((double)*pvVar1 < this->splitValue || (double)*pvVar1 == this->splitValue) {
      peVar2 = std::
               __shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->right);
      std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::shared_ptr(local_50,i_inData);
      this_local = (Node<float> *)PredictOneSample(peVar2,local_50);
      std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr(local_50);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::shared_ptr(&local_30,i_inData);
      this_local = (Node<float> *)PredictOneSample(peVar2,&local_30);
      std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr(&local_30);
    }
  }
  return (double)this_local;
}

Assistant:

double RandomForest::Node<T>::PredictOneSample(const std::shared_ptr<std::vector<T> > i_inData)
{
    if (featureIndex == -1)
    {
        return splitValue;
    }
    if (i_inData->at(featureIndex)>splitValue)
    {
        return left->PredictOneSample(i_inData);
    }
    else
    {
        return right->PredictOneSample(i_inData);
    }
}